

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

Maybe<unsigned_long_long> __thiscall
kj::anon_unknown_55::tryParseUnsigned(anon_unknown_55 *this,StringPtr *s,unsigned_long_long max)

{
  char *pcVar1;
  int __base;
  bool bVar2;
  char *in_RAX;
  int *piVar3;
  ulonglong uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 aVar5;
  Maybe<unsigned_long_long> MVar6;
  char *endPtr;
  
  aVar5.value = max;
  if (1 < (s->content).size_) {
    endPtr = in_RAX;
    piVar3 = __errno_location();
    *piVar3 = 0;
    pcVar1 = (s->content).ptr;
    bVar2 = isHex(pcVar1);
    __base = 10;
    if (bVar2) {
      __base = 0x10;
    }
    uVar4 = strtoull(pcVar1,&endPtr,__base);
    pcVar1 = (s->content).ptr;
    aVar5.value = (long)pcVar1 + ((s->content).size_ - 1);
    if (((endPtr == (char *)aVar5.value) &&
        (aVar5._1_7_ = (undefined7)((ulong)aVar5 >> 8), aVar5.value._0_1_ = *piVar3 == 0x22,
        uVar4 <= max && *piVar3 != 0x22)) && (*pcVar1 != '-')) {
      *this = (anon_unknown_55)0x1;
      *(ulonglong *)(this + 8) = uVar4;
      goto LAB_003ff88f;
    }
  }
  *this = (anon_unknown_55)0x0;
LAB_003ff88f:
  MVar6.ptr.field_1.value = aVar5.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long_long>)MVar6.ptr;
}

Assistant:

Maybe<unsigned long long> tryParseUnsigned(const StringPtr& s, unsigned long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || max < value || s[0] == '-') { return kj::none; }
  return value;
}